

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::PrepareReferenceData<3u>
          (CompressedSubImageTest *this,GLenum internalformat)

{
  code *pcVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  GLubyte *pGVar7;
  GLuint local_28;
  int local_24;
  GLint compressed_texture_size;
  GLint is_compressed_texture;
  Functions *gl;
  CompressedSubImageTest *pCStack_10;
  GLenum internalformat_local;
  CompressedSubImageTest *this_local;
  
  gl._4_4_ = internalformat;
  pCStack_10 = this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  _compressed_texture_size = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(_compressed_texture_size + 0xb8);
  GVar3 = TextureTarget<3u>(this);
  (*pcVar1)(GVar3,this->m_to_aux);
  dVar4 = (**(code **)(_compressed_texture_size + 0x800))();
  glu::checkError(dVar4,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1234);
  TextureImage<3u>(this,gl._4_4_);
  if (this->m_reference != (GLubyte *)0x0) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0;
    __cxa_throw(puVar6,&int::typeinfo,0);
  }
  local_24 = 0;
  pcVar1 = *(code **)(_compressed_texture_size + 0xab0);
  GVar3 = TextureTarget<3u>(this);
  (*pcVar1)(GVar3,0,0x86a1,&local_24);
  if (local_24 != 0) {
    local_28 = 0;
    pcVar1 = *(code **)(_compressed_texture_size + 0xab0);
    GVar3 = TextureTarget<3u>(this);
    (*pcVar1)(GVar3,0,0x86a0,&local_28);
    if (local_28 != 0) {
      pGVar7 = (GLubyte *)operator_new__((long)(int)local_28);
      this->m_reference = pGVar7;
      if (this->m_reference == (GLubyte *)0x0) {
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
      this->m_reference_size = local_28;
      pcVar1 = *(code **)(_compressed_texture_size + 0x7c8);
      GVar3 = TextureTarget<3u>(this);
      (*pcVar1)(GVar3,0,this->m_reference);
      dVar4 = (**(code **)(_compressed_texture_size + 0x800))();
      glu::checkError(dVar4,"glGetCompressedTexImage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x1259);
    }
  }
  return;
}

Assistant:

void CompressedSubImageTest::PrepareReferenceData(glw::GLenum internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Using OpenGL to compress raw data. */
	gl.bindTexture(TextureTarget<D>(), m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	TextureImage<D>(internalformat);

	/* Sanity checks. */
	if (DE_NULL != m_reference)
	{
		throw 0;
	}

	/* Check that really compressed texture. */
	glw::GLint is_compressed_texture = 0;
	gl.getTexLevelParameteriv(TextureTarget<D>(), 0, GL_TEXTURE_COMPRESSED, &is_compressed_texture);

	if (is_compressed_texture)
	{
		/* Query texture size. */
		glw::GLint compressed_texture_size = 0;
		gl.getTexLevelParameteriv(TextureTarget<D>(), 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE, &compressed_texture_size);

		/* If compressed then download. */
		if (compressed_texture_size)
		{
			/* Prepare storage. */
			m_reference = new glw::GLubyte[compressed_texture_size];

			if (DE_NULL != m_reference)
			{
				m_reference_size = compressed_texture_size;
			}
			else
			{
				throw 0;
			}

			/* Download compressed texture image. */
			gl.getCompressedTexImage(TextureTarget<D>(), 0, m_reference);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");
		}
	}
}